

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall dmlc::JSONReader::ReadNumber<long>(JSONReader *this,long *out_value)

{
  ostream *poVar1;
  string local_1b8;
  LogMessageFatal local_198;
  
  std::istream::_M_extract<long>((long *)this->is_);
  if (((byte)this->is_[*(long *)(*(long *)this->is_ + -0x18) + 0x20] & 5) != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Check failed: !is_->fail()",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Error at",8);
    line_info_abi_cxx11_(&local_1b8,this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Expect number",0xf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  return;
}

Assistant:

inline void JSONReader::ReadNumber(ValueType *out_value) {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *is_ >> *out_value;
  CHECK(!is_->fail())
      << "Error at" << line_info()
      << ", Expect number";
#else
  char *endptr;
  const char *icstr = is_->c_str();
  unsigned number = strtol(icstr, &endptr, 10);
  is_->erase(0, endptr - icstr);
  *out_value = static_cast<ValueType>(number);
#endif
}